

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Array2D<double> * __thiscall
pbrt::SummedAreaTable::integrate
          (Array2D<double> *__return_storage_ptr__,SummedAreaTable *this,Array2D<float> *values,
          Allocator alloc)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  int y;
  Tuple2<pbrt::Point2,_int> p;
  long lVar7;
  int y_1;
  int y_00;
  Tuple2<pbrt::Point2,_int> p_00;
  float fVar8;
  anon_class_8_1_70098e60 f;
  
  f.values = values;
  Array2D<double>::Array2D
            (__return_storage_ptr__,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y,
             (allocator_type)alloc.memoryResource);
  fVar8 = integrate::anon_class_8_1_70098e60::operator()(&f,0,0);
  pdVar5 = Array2D<double>::operator[](__return_storage_ptr__,(Point2i)0x0);
  *pdVar5 = (double)fVar8;
  p.x = 1;
  p.y = 0;
  for (; (long)p < (long)(__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
                   (long)(__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
      p = (Tuple2<pbrt::Point2,_int>)((long)p + 1)) {
    fVar8 = integrate::anon_class_8_1_70098e60::operator()(&f,p.x,0);
    pdVar5 = Array2D<double>::operator[](__return_storage_ptr__,(Point2i)(p + -1));
    dVar1 = *pdVar5;
    pdVar5 = Array2D<double>::operator[](__return_storage_ptr__,(Point2i)p);
    *pdVar5 = (double)fVar8 + dVar1;
  }
  lVar7 = 1;
  p_00.x = 0;
  p_00.y = 0;
  while( true ) {
    iVar6 = (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    iVar4 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar6 - iVar4 <= lVar7) break;
    fVar8 = integrate::anon_class_8_1_70098e60::operator()(&f,0,(int)lVar7);
    pdVar5 = Array2D<double>::operator[](__return_storage_ptr__,(Point2i)p_00);
    p_00 = (Tuple2<pbrt::Point2,_int>)((long)p_00 + 0x100000000);
    dVar1 = *pdVar5;
    pdVar5 = Array2D<double>::operator[](__return_storage_ptr__,(Point2i)p_00);
    lVar7 = lVar7 + 1;
    *pdVar5 = (double)fVar8 + dVar1;
  }
  for (y_00 = 1; y_00 < iVar6 - iVar4; y_00 = y_00 + 1) {
    for (iVar6 = 1;
        iVar6 < (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
                (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
        iVar6 = iVar6 + 1) {
      fVar8 = integrate::anon_class_8_1_70098e60::operator()(&f,iVar6,y_00);
      pdVar5 = Array2D<double>::operator()(__return_storage_ptr__,iVar6 + -1,y_00);
      dVar1 = *pdVar5;
      pdVar5 = Array2D<double>::operator()(__return_storage_ptr__,iVar6,y_00 + -1);
      dVar2 = *pdVar5;
      pdVar5 = Array2D<double>::operator()(__return_storage_ptr__,iVar6 + -1,y_00 + -1);
      dVar3 = *pdVar5;
      pdVar5 = Array2D<double>::operator()(__return_storage_ptr__,iVar6,y_00);
      *pdVar5 = ((double)fVar8 + dVar1 + dVar2) - dVar3;
    }
    iVar4 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar6 = (__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<double> integrate(const Array2D<Float> &values, Allocator alloc) {
        auto f = [&values](int x, int y) {
            return values(x, y) / (values.xSize() * values.ySize());
        };
        Array2D<double> result(values.xSize(), values.ySize(), alloc);
        result(0, 0) = f(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < result.xSize(); ++x)
            result(x, 0) = f(x, 0) + result(x - 1, 0);
        for (int y = 1; y < result.ySize(); ++y)
            result(0, y) = f(0, y) + result(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < result.ySize(); ++y)
            for (int x = 1; x < result.xSize(); ++x)
                result(x, y) = (f(x, y) + result(x - 1, y) + result(x, y - 1) -
                                result(x - 1, y - 1));

        return result;
    }